

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::StaticInitializerVisitor::visit<slang::ast::StructuredAssignmentPatternExpression>
          (StaticInitializerVisitor *this,StructuredAssignmentPatternExpression *expr)

{
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__v;
  ExpressionKind EVar1;
  SymbolKind SVar2;
  SystemSubroutine *pSVar3;
  long lVar4;
  optional<bool> oVar5;
  int iVar6;
  Symbol *this_00;
  Expression *pEVar7;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar8;
  Diagnostic *this_01;
  Diagnostic *this_02;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar9;
  SourceLocation SVar10;
  DiagCode code;
  ASTContext *this_03;
  size_t i_1;
  size_t i;
  long lVar12;
  bool bVar13;
  ArgList AVar14;
  SourceRange sourceRange;
  SourceLocation SVar11;
  
  EVar1 = (expr->super_AssignmentPatternExpressionBase).super_Expression.kind;
  if (EVar1 - NamedValue < 2) {
    this_00 = Expression::getSymbolReference((Expression *)expr,true);
    if (this_00 != (Symbol *)0x0) {
      SVar2 = this_00->kind;
      if ((SVar2 == ModportPort) || (SVar2 == Net)) {
        this_03 = this->context;
        SVar11 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc
        ;
        SVar10 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc;
        code.subsystem = Declarations;
        code.code = 0xf8;
LAB_002e6f96:
        sourceRange.endLoc = SVar10;
        sourceRange.startLoc = SVar11;
        this_01 = ASTContext::addDiag(this_03,code,sourceRange);
        this_02 = Diagnostic::operator<<(this_01,this->sourceVar->name);
        Diagnostic::operator<<(this_02,this_00->name);
        Diagnostic::addNote(this_01,(DiagCode)0x50001,this_00->location);
        return;
      }
      if ((SVar2 == Variable) && (this_00 != this->sourceVar)) {
        pEVar7 = DeclaredType::getInitializer((DeclaredType *)(this_00 + 1));
        bVar13 = this_00[5].name._M_len != 0;
        oVar5 = Symbol::isDeclaredBefore(this_00,this->sourceVar);
        if ((bVar13 || pEVar7 == (Expression *)0x0) ||
           ((((ushort)oVar5.super__Optional_base<bool,_true,_true>._M_payload.
                      super__Optional_payload_base<bool> & 0x100) == 0 ||
            (((ushort)oVar5.super__Optional_base<bool,_true,_true>._M_payload.
                      super__Optional_payload_base<bool> & 1) == 0)))) {
          code = (DiagCode)((uint)(bVar13 || pEVar7 == (Expression *)0x0) * 0x10000 + 0xf70006);
          this_03 = this->context;
          SVar11 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.
                   startLoc;
          SVar10 = (expr->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc
          ;
          goto LAB_002e6f96;
        }
      }
    }
  }
  else if (EVar1 == Call) {
    CallExpression::visitExprsNoArgs<slang::ast::StaticInitializerVisitor&>
              ((CallExpression *)expr,this);
    __v = &(expr->super_AssignmentPatternExpressionBase).elements_;
    if (*(char *)&(expr->indexSetters)._M_ptr == '\x01') {
      pvVar8 = std::
               get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                         ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                           *)__v);
      pSVar3 = (pvVar8->subroutine).ptr;
      pEVar7 = expr->defaultSetter;
      lVar4 = *(long *)&expr[1].super_AssignmentPatternExpressionBase.super_Expression;
      for (lVar12 = 0; lVar4 != lVar12; lVar12 = lVar12 + 1) {
        iVar6 = (*pSVar3->_vptr_SystemSubroutine[4])(pSVar3,lVar12);
        if ((char)iVar6 == '\0') {
          Expression::visit<slang::ast::StaticInitializerVisitor&>
                    (*(Expression **)(&pEVar7->kind + lVar12 * 2),this);
        }
      }
    }
    else {
      ppSVar9 = std::
                get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                          ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            *)__v);
      AVar14 = SubroutineSymbol::getArguments(*ppSVar9);
      pEVar7 = expr->defaultSetter;
      lVar4 = *(long *)&expr[1].super_AssignmentPatternExpressionBase.super_Expression;
      for (lVar12 = 0; lVar4 != lVar12; lVar12 = lVar12 + 1) {
        if (AVar14._M_ptr[lVar12]->direction == In) {
          Expression::visit<slang::ast::StaticInitializerVisitor&>
                    (*(Expression **)(&pEVar7->kind + lVar12 * 2),this);
        }
      }
    }
  }
  else if (EVar1 != NewCovergroup) {
    StructuredAssignmentPatternExpression::visitExprs<slang::ast::StaticInitializerVisitor&>
              (expr,this);
    return;
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue: {
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind == SymbolKind::Variable) {
                            // Don't warn if this is the same var.
                            auto& var = sym->template as<VariableSymbol>();
                            if (&var == &sourceVar)
                                return;

                            const bool hasInit = var.getInitializer();
                            const bool isFromPort = var.getFirstPortBackref();
                            const bool isDeclaredBefore = var.isDeclaredBefore(sourceVar).value_or(
                                false);

                            // We warn unless this var has an initializer, is declared
                            // before us in the same instance, and isn't attached to a port.
                            if (hasInit && !isFromPort && isDeclaredBefore)
                                return;

                            auto code = (hasInit && !isFromPort) ? diag::StaticInitOrder
                                                                 : diag::StaticInitValue;
                            auto& diag = context.addDiag(code, expr.sourceRange);
                            diag << sourceVar.name << var.name;
                            diag.addNote(diag::NoteDeclarationHere, var.location);
                        }
                        else if (sym->kind == SymbolKind::Net ||
                                 sym->kind == SymbolKind::ModportPort) {
                            auto& diag = context.addDiag(diag::StaticInitValue, expr.sourceRange);
                            diag << sourceVar.name << sym->name;
                            diag.addNote(diag::NoteDeclarationHere, sym->location);
                        }
                    }
                    break;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    call.visitExprsNoArgs(*this);

                    if (call.isSystemCall()) {
                        // Ignore unevaluated arguments to system calls.
                        auto& sub = *std::get<1>(call.subroutine).subroutine;
                        auto args = call.arguments();
                        for (size_t i = 0; i < args.size(); i++) {
                            if (!sub.isArgUnevaluated(i))
                                args[i]->visit(*this);
                        }
                    }
                    else {
                        // Skip over output, inout, and ref args.
                        auto& sub = *std::get<0>(call.subroutine);
                        auto formals = sub.getArguments();
                        auto args = call.arguments();
                        SLANG_ASSERT(formals.size() == args.size());
                        for (size_t i = 0; i < args.size(); i++) {
                            if (formals[i]->direction == ArgumentDirection::In)
                                args[i]->visit(*this);
                        }
                    }
                    break;
                }
                case ExpressionKind::NewCovergroup:
                    // Ignore new covergroup expressions.
                    break;
                default:
                    if constexpr (HasVisitExprs<T, StaticInitializerVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }